

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O1

int Abc_NtkCleanup(Abc_Ntk_t *pNtk,int fVerbose)

{
  uint uVar1;
  Vec_Ptr_t *vNodes;
  
  if (pNtk->ntkType == ABC_NTK_LOGIC) {
    vNodes = Abc_NtkDfs(pNtk,0);
    uVar1 = Abc_NtkReduceNodes(pNtk,vNodes);
    if (fVerbose != 0) {
      printf("Cleanup removed %d dangling nodes.\n",(ulong)uVar1);
    }
    if (vNodes->pArray != (void **)0x0) {
      free(vNodes->pArray);
      vNodes->pArray = (void **)0x0;
    }
    if (vNodes != (Vec_Ptr_t *)0x0) {
      free(vNodes);
    }
    return uVar1;
  }
  __assert_fail("Abc_NtkIsLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                ,0x1e2,"int Abc_NtkCleanup(Abc_Ntk_t *, int)");
}

Assistant:

int Abc_NtkCleanup( Abc_Ntk_t * pNtk, int fVerbose )
{
    Vec_Ptr_t * vNodes;
    int Counter;
    assert( Abc_NtkIsLogic(pNtk) );
    // mark the nodes reachable from the POs
    vNodes = Abc_NtkDfs( pNtk, 0 );
    Counter = Abc_NtkReduceNodes( pNtk, vNodes );
    if ( fVerbose )
        printf( "Cleanup removed %d dangling nodes.\n", Counter );
    Vec_PtrFree( vNodes );
    return Counter;
}